

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxinternal.c
# Opt level: O2

WebPMuxError ChunkAppend(WebPChunk *chunk,WebPChunk ***chunk_list)

{
  WebPChunk *pWVar1;
  WebPChunk *pWVar2;
  WebPChunk **chunk_list_00;
  
  pWVar1 = **chunk_list;
  if (pWVar1 == (WebPChunk *)0x0) {
    ChunkSetHead(chunk,*chunk_list);
  }
  else {
    do {
      pWVar2 = pWVar1;
      pWVar1 = pWVar2->next_;
    } while (pWVar1 != (WebPChunk *)0x0);
    chunk_list_00 = &pWVar2->next_;
    ChunkSetHead(chunk,chunk_list_00);
    *chunk_list = chunk_list_00;
  }
  return WEBP_MUX_OK;
}

Assistant:

WebPMuxError ChunkAppend(WebPChunk* const chunk,
                         WebPChunk*** const chunk_list) {
  assert(chunk_list != NULL && *chunk_list != NULL);

  if (**chunk_list == NULL) {
    ChunkSetHead(chunk, *chunk_list);
  } else {
    WebPChunk* last_chunk = **chunk_list;
    while (last_chunk->next_ != NULL) last_chunk = last_chunk->next_;
    ChunkSetHead(chunk, &last_chunk->next_);
    *chunk_list = &last_chunk->next_;
  }
  return WEBP_MUX_OK;
}